

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trw.h
# Opt level: O2

void __thiscall libDAI::TRW::TRW(TRW *this,TRW *x)

{
  double dVar1;
  double dVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  double dVar7;
  undefined4 uVar8;
  
  DAIAlg<libDAI::FactorGraph>::DAIAlg(&this->super_DAIAlgFG,&x->super_DAIAlgFG);
  (this->super_DAIAlgFG).super_InferenceAlgorithm._vptr_InferenceAlgorithm =
       (_func_int **)&PTR_clone_0061f778;
  uVar8 = *(undefined4 *)&(x->Props).field_0x4;
  dVar1 = (x->Props).tol;
  dVar2 = (x->Props).outertol;
  sVar3 = (x->Props).maxiter;
  sVar4 = (x->Props).maxiter;
  sVar5 = (x->Props).maxouteriter;
  sVar6 = (x->Props).verbose;
  dVar7 = (x->Props).damping;
  (this->Props).updates = (UpdateType)(x->Props).updates.v;
  *(undefined4 *)&(this->Props).field_0x4 = uVar8;
  (this->Props).tol = dVar1;
  (this->Props).outertol = dVar2;
  (this->Props).maxiter = sVar3;
  (this->Props).maxiter = sVar4;
  (this->Props).maxouteriter = sVar5;
  (this->Props).verbose = sVar6;
  (this->Props).damping = dVar7;
  this->_maxdiff = x->_maxdiff;
  this->_iterations = x->_iterations;
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            (&this->_messages,&x->_messages);
  std::vector<libDAI::TProb<double>,_std::allocator<libDAI::TProb<double>_>_>::vector
            (&this->_newmessages,&x->_newmessages);
  std::
  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ::_Rb_tree((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
              *)&this->_rho_e,
             (_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
              *)&x->_rho_e);
  std::
  _Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
  ::_Rb_tree((_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
              *)&this->_rho_e_descent,
             (_Rb_tree<libDAI::UEdge,_std::pair<const_libDAI::UEdge,_double>,_std::_Select1st<std::pair<const_libDAI::UEdge,_double>_>,_std::less<libDAI::UEdge>,_std::allocator<std::pair<const_libDAI::UEdge,_double>_>_>
              *)&x->_rho_e_descent);
  return;
}

Assistant:

TRW & operator=( const TRW & x ) {
                if( this != &x ) {
                    DAIAlgFG::operator=( x );
                    Props          = x.Props;
                    _maxdiff       = x._maxdiff;
                    _iterations    = x._iterations;
                    _messages      = x._messages;
                    _newmessages   = x._newmessages;
                    _rho_e         = x._rho_e;
                    _rho_e_descent = x._rho_e_descent;
                }
                return *this;
            }